

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O1

_Bool ecs_query_next(ecs_iter_t *it)

{
  int iVar1;
  int iVar2;
  ecs_query_t *peVar3;
  ecs_table_t *peVar4;
  ecs_vector_t *vector;
  ecs_table_t *vector_00;
  ecs_switch_t *sw;
  undefined1 uVar5;
  int32_t iVar6;
  int32_t iVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  ecs_data_t *peVar11;
  undefined8 *puVar12;
  ecs_bs_column_t *peVar13;
  ulong *puVar14;
  void *pvVar15;
  ecs_data_t *peVar16;
  ecs_sw_column_t *peVar17;
  uint64_t uVar18;
  int *piVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  ecs_iter_table_t *peVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  uint64_t *puVar29;
  int iVar30;
  bool bVar31;
  ecs_world_t *world;
  int local_d0;
  uint local_cc;
  int local_c8;
  int local_c4;
  long local_60;
  ecs_world_t *local_38;
  
  _ecs_assert(it != (ecs_iter_t *)0x0,2,(char *)0x0,"it != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0xae8);
  if (it == (ecs_iter_t *)0x0) {
    __assert_fail("it != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0xae8,"_Bool ecs_query_next(ecs_iter_t *)");
  }
  local_38 = it->world;
  peVar3 = it->query;
  ecs_get_stage(&local_38);
  pvVar8 = _ecs_vector_first(peVar3->table_slices,0x10,0x10);
  pvVar9 = _ecs_vector_first(peVar3->tables,0x50,0x10);
  if (pvVar8 == (void *)0x0) {
    _ecs_assert(true,0xc,(char *)0x0,"!slice || query->compare",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0xaf4);
  }
  else {
    _ecs_assert(peVar3->compare != (ecs_compare_action_t)0x0,0xc,(char *)0x0,
                "!slice || query->compare",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0xaf4);
    if (peVar3->compare == (ecs_compare_action_t)0x0) {
      __assert_fail("!slice || query->compare",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                    ,0xaf4,"_Bool ecs_query_next(ecs_iter_t *)");
    }
  }
  iVar30 = it->total_count;
  uVar22 = (it->iter).query.index;
  local_cc = it->table_count;
  if (it->table_count < (int)uVar22) {
    local_cc = uVar22;
  }
  lVar10 = (long)(int)local_cc;
  local_60 = (long)(int)uVar22;
  do {
    if (local_60 == lVar10) {
      local_cc._0_1_ = 0;
      break;
    }
    if (pvVar8 == (void *)0x0) {
      peVar25 = (ecs_iter_table_t *)(local_60 * 0x50 + (long)pvVar9);
    }
    else {
      peVar25 = *(ecs_iter_table_t **)((long)pvVar8 + local_60 * 0x10);
    }
    peVar4 = peVar25->table;
    (it->iter).query.index = (int32_t)(local_60 + 1);
    if (peVar4 == (ecs_table_t *)0x0) {
LAB_0011ad08:
      it->table = peVar25;
      it->frame_offset = it->frame_offset + iVar30;
      local_cc = 1;
      local_c4 = 1;
      if (peVar4 != (ecs_table_t *)0x0) {
        if ((peVar3->flags & 0x400) != 0) {
          peVar4 = peVar25->table;
          local_c4 = 1;
          if ((peVar4 == (ecs_table_t *)0x0) || (peVar4->dirty_state == (int32_t *)0x0))
          goto LAB_0011adad;
          uVar22 = ecs_vector_count((peVar3->sig).columns);
          pvVar15 = _ecs_vector_first((peVar3->sig).columns,0x28,0x10);
          if (0 < (int)uVar22) {
            piVar19 = (int *)((long)pvVar15 + 8);
            uVar28 = 0;
            do {
              if ((*piVar19 != 1) && (0 < (long)peVar25->columns[uVar28])) {
                peVar4->dirty_state[peVar25->columns[uVar28]] =
                     peVar4->dirty_state[peVar25->columns[uVar28]] + 1;
              }
              uVar28 = uVar28 + 1;
              piVar19 = piVar19 + 10;
            } while (uVar22 != uVar28);
          }
        }
        local_c4 = 1;
      }
    }
    else {
      vector = (ecs_vector_t *)peVar25[1].columns;
      vector_00 = peVar25[1].table;
      peVar11 = ecs_table_get_data(peVar4);
      _ecs_assert(peVar11 != (ecs_data_t *)0x0,0xc,(char *)0x0,"data != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0xb06);
      if (peVar11 == (ecs_data_t *)0x0) {
        __assert_fail("data != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0xb06,"_Bool ecs_query_next(ecs_iter_t *)");
      }
      it->table_columns = peVar11->columns;
      if (pvVar8 == (void *)0x0) {
        local_d0 = ecs_table_count(peVar4);
        local_c8 = 0;
      }
      else {
        local_c8 = *(int *)((long)pvVar8 + local_60 * 0x10 + 8);
        local_d0 = *(int *)((long)pvVar8 + local_60 * 0x10 + 0xc);
      }
      if (local_d0 == 0) {
LAB_0011abec:
        local_c4 = 4;
      }
      else {
        if (vector_00 != (ecs_table_t *)0x0) {
          iVar6 = ecs_vector_count((ecs_vector_t *)vector_00);
          puVar12 = (undefined8 *)_ecs_vector_first((ecs_vector_t *)vector_00,0x10,0x10);
          if (0 < iVar6) {
            iVar30 = peVar4->bs_column_offset;
            uVar22 = (it->iter).query.bitset_first;
            peVar13 = (ecs_bs_column_t *)*puVar12;
            if (peVar13 == (ecs_bs_column_t *)0x0) {
              peVar11 = peVar4->data;
              iVar23 = *(int *)(puVar12 + 1);
              _ecs_assert(-1 < iVar23 - iVar30,0xc,(char *)0x0,"(index - bs_offset >= 0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0xa5a);
              uVar20 = iVar23 - iVar30;
              if ((int)uVar20 < 0) {
                __assert_fail("(index - bs_offset >= 0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                              ,0xa5a,
                              "int bitset_column_next(ecs_table_t *, ecs_vector_t *, ecs_query_iter_t *, ecs_page_cursor_t *)"
                             );
              }
              peVar13 = peVar11->bs_columns + uVar20;
              *puVar12 = peVar13;
            }
            iVar30 = (int)uVar22 >> 6;
            iVar23 = (peVar13->data).count + -1 >> 6;
            lVar10 = 5;
            if (iVar23 < iVar30) goto LAB_0011a958;
            puVar29 = (peVar13->data).data;
            uVar20 = uVar22 & 0x3f;
            lVar10 = (long)iVar30;
            uVar18 = puVar29[lVar10];
            if ((*(ulong *)(bitset_column_next_bitmask_remain + (ulong)uVar20 * 8) & uVar18) != 0)
            goto LAB_0011a7a4;
            if (iVar30 <= iVar23) {
              iVar30 = iVar23;
            }
            goto LAB_0011a785;
          }
          (it->iter).query.bitset_first = 0;
          (it->iter).query.index = (int32_t)local_60;
        }
        if (vector != (ecs_vector_t *)0x0) {
          iVar23 = (it->iter).query.sparse_smallest;
          iVar6 = iVar23;
          if (iVar23 == 0) {
            pvVar15 = _ecs_vector_first(vector,0x18,0x10);
            uVar22 = ecs_vector_count(vector);
            if ((int)uVar22 < 1) {
              iVar6 = 0;
            }
            else {
              lVar27 = 0;
              iVar21 = 0x7fffffff;
              iVar24 = 1;
              iVar6 = 0;
              do {
                peVar17 = *(ecs_sw_column_t **)((long)pvVar15 + lVar27);
                if (peVar17 == (ecs_sw_column_t *)0x0) {
                  iVar1 = peVar25->columns[*(int *)((long)pvVar15 + lVar27 + 0x10)];
                  iVar2 = peVar4->sw_column_offset;
                  _ecs_assert(0 < iVar1 - iVar2,0xc,(char *)0x0,"table_column_index >= 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                              ,0x9b9);
                  if (iVar1 - iVar2 == 0 || iVar1 < iVar2) {
                    __assert_fail("table_column_index >= 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                  ,0x9b9,
                                  "int find_smallest_column(ecs_table_t *, ecs_matched_table_t *, ecs_vector_t *)"
                                 );
                  }
                  peVar16 = ecs_table_get_data(peVar4);
                  peVar17 = peVar16->sw_columns + ((ulong)(uint)(iVar1 - iVar2) - 1);
                  *(ecs_sw_column_t **)((long)pvVar15 + lVar27) = peVar17;
                }
                iVar7 = ecs_switch_case_count
                                  (peVar17->data,*(uint64_t *)((long)pvVar15 + lVar27 + 8));
                if (iVar7 < iVar21) {
                  iVar21 = iVar7;
                  iVar6 = iVar24;
                }
                lVar27 = lVar27 + 0x18;
                iVar24 = iVar24 + 1;
              } while ((ulong)uVar22 * 0x18 != lVar27);
            }
            (it->iter).query.sparse_smallest = iVar6;
          }
          uVar22 = iVar6 - 1;
          pvVar15 = _ecs_vector_first(vector,0x18,0x10);
          sw = (ecs_switch_t *)**(undefined8 **)((long)pvVar15 + (long)(int)uVar22 * 0x18);
          if (iVar23 == 0) {
            iVar23 = ecs_switch_first(sw,*(uint64_t *)((long)pvVar15 + (long)(int)uVar22 * 0x18 + 8)
                                     );
          }
          else {
            iVar23 = ecs_switch_next(sw,(it->iter).query.sparse_first);
          }
          if (iVar23 == -1) {
LAB_0011abc7:
            *(ecs_match_kind_t *)((long)&it->iter + 0x10) = EcsMatchDefault;
            *(ecs_match_kind_t *)((long)&it->iter + 0x14) = EcsMatchDefault;
            bVar31 = true;
          }
          else {
            uVar20 = ecs_vector_count(vector);
            do {
              uVar28 = 0;
              puVar29 = (uint64_t *)((long)pvVar15 + 8);
              if (0 < (int)uVar20) {
                do {
                  if (((uVar22 != uVar28) &&
                      (uVar18 = ecs_switch_get(*(ecs_switch_t **)puVar29[-1],iVar23),
                      uVar18 != *puVar29)) && (iVar23 = ecs_switch_next(sw,iVar23), iVar23 == -1))
                  goto LAB_0011abc7;
                  uVar28 = uVar28 + 1;
                  puVar29 = puVar29 + 3;
                } while (uVar20 != uVar28);
              }
            } while ((uint)uVar28 != uVar20);
            (it->iter).query.sparse_first = iVar23;
            local_d0 = 1;
            bVar31 = false;
            local_c8 = iVar23;
          }
          if (bVar31) goto LAB_0011abec;
          (it->iter).query.index = (int32_t)local_60;
        }
        iVar23 = (it->iter).query.page_iter.offset;
        iVar21 = (it->iter).query.page_iter.limit;
        iVar24 = local_d0;
        if (iVar23 == 0 && iVar21 == 0) {
LAB_0011ac8c:
          uVar22 = (uint)(iVar24 == 0);
        }
        else {
          iVar24 = (it->iter).query.page_iter.remaining;
          if (iVar23 == 0) {
LAB_0011ac58:
            if (iVar24 == 0) {
              uVar22 = 0xffffffff;
              iVar24 = local_d0;
              if (iVar21 != 0) goto LAB_0011ac8f;
            }
            else {
              iVar23 = iVar24 - local_d0;
              bVar31 = iVar23 == 0;
              if (bVar31 || iVar24 < local_d0) {
                iVar23 = 0;
              }
              iVar21 = iVar24;
              if (local_d0 <= iVar24) {
                iVar21 = local_d0;
              }
              if (bVar31 || iVar24 < local_d0) {
                local_d0 = 1;
              }
              (it->iter).query.page_iter.remaining = iVar23;
              iVar24 = local_d0;
              local_d0 = iVar21;
            }
            goto LAB_0011ac8c;
          }
          if (iVar23 - local_d0 == 0 || iVar23 < local_d0) {
            local_c8 = local_c8 + iVar23;
            local_d0 = local_d0 - iVar23;
            (it->iter).query.page_iter.offset = 0;
            goto LAB_0011ac58;
          }
          (it->iter).query.page_iter.offset = iVar23 - local_d0;
          uVar22 = 1;
        }
LAB_0011ac8f:
        local_cc = (uint)(-1 < (int)uVar22 & (byte)local_cc);
        local_c4 = (uint)(uVar22 != 0) << 2;
        if ((int)uVar22 < 0) {
          local_c4 = 1;
        }
        if (uVar22 == 0) {
          pvVar15 = _ecs_vector_first(peVar11->entities,8,0x10);
          it->entities = (ecs_entity_t *)((long)pvVar15 + (long)local_c8 * 8);
          it->offset = local_c8;
          it->count = local_d0;
          it->total_count = local_d0;
          local_c4 = 0;
        }
      }
      if (local_c4 == 0) goto LAB_0011ad08;
    }
LAB_0011adad:
    local_60 = local_60 + 1;
  } while (local_c4 == 4);
  return (_Bool)((byte)local_cc & 1);
  while( true ) {
    uVar18 = puVar29[lVar10 + 1];
    lVar10 = lVar10 + 1;
    if (uVar18 != 0) break;
LAB_0011a785:
    if (iVar30 == lVar10) goto LAB_0011a8f9;
  }
  uVar20 = 0;
  iVar30 = (int)lVar10;
LAB_0011a7a4:
  iVar21 = iVar23 + 1;
  uVar28 = (ulong)uVar20;
  while (((&bitset_column_next_bitmask)[uVar28] & uVar18) == 0) {
    uVar26 = uVar28 + 1;
    _ecs_assert(uVar28 < 0x3f,0xc,(char *)0x0,"bs_start < 64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0xa7f);
    uVar28 = uVar26;
    if (uVar26 == 0x40) {
      __assert_fail("bs_start < 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                    ,0xa7f,
                    "int bitset_column_next(ecs_table_t *, ecs_vector_t *, ecs_query_iter_t *, ecs_page_cursor_t *)"
                   );
    }
  }
  if ((*(ulong *)(bitset_column_next_bitmask_remain + uVar28 * 8) & ~uVar18) == 0) {
    uVar26 = 0;
    iVar24 = iVar21;
    if (iVar30 != iVar23) {
      lVar10 = 0;
      do {
        uVar18 = puVar29[(long)iVar30 + lVar10 + 1];
        if (uVar18 != 0xffffffffffffffff) {
          iVar24 = iVar30 + (int)lVar10 + 1;
          break;
        }
        lVar10 = lVar10 + 1;
      } while ((long)iVar23 - (long)iVar30 != lVar10);
    }
  }
  else {
    uVar26 = uVar28 & 0xffffffff;
    iVar24 = iVar30;
  }
  iVar23 = (int)uVar26;
  if (iVar24 != iVar21) {
    iVar23 = iVar23 + -1;
    puVar14 = &bitset_column_next_bitmask + uVar26;
    do {
      iVar23 = iVar23 + 1;
      uVar26 = *puVar14;
      puVar14 = puVar14 + 1;
    } while ((uVar26 & uVar18) != 0);
  }
  _ecs_assert(iVar23 < 0x40,0xc,(char *)0x0,"bs_end < 64",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0xa9a);
  if (0x3f < iVar23) {
    __assert_fail("bs_end < 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0xa9a,
                  "int bitset_column_next(ecs_table_t *, ecs_vector_t *, ecs_query_iter_t *, ecs_page_cursor_t *)"
                 );
  }
  uVar22 = iVar30 * 0x40 + (int)uVar28;
  if (uVar22 == iVar23 + iVar24 * 0x40) {
LAB_0011a8f9:
    lVar10 = 5;
  }
  else {
    (it->iter).query.bitset_first = uVar22;
    lVar10 = 0;
  }
LAB_0011a958:
  uVar5 = (*(code *)((long)&DAT_0013f034 + (long)(int)(&DAT_0013f034)[lVar10]))(uVar22,0);
  return (_Bool)uVar5;
}

Assistant:

bool ecs_query_next(
    ecs_iter_t *it)
{
    ecs_assert(it != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_query_iter_t *iter = &it->iter.query;
    ecs_page_iter_t *piter = &iter->page_iter;
    ecs_world_t *world = it->world;
    ecs_query_t *query = it->query;

    ecs_get_stage(&world);
    ecs_table_slice_t *slice = ecs_vector_first(
        query->table_slices, ecs_table_slice_t);
    ecs_matched_table_t *tables = ecs_vector_first(
        query->tables, ecs_matched_table_t);

    ecs_assert(!slice || query->compare, ECS_INTERNAL_ERROR, NULL);
    
    ecs_page_cursor_t cur;
    int32_t table_count = it->table_count;
    int32_t prev_count = it->total_count;

    int i;
    for (i = iter->index; i < table_count; i ++) {
        ecs_matched_table_t *table_data = slice ? slice[i].table : &tables[i];
        ecs_table_t *table = table_data->iter_data.table;
        ecs_data_t *data = NULL;

        iter->index = i + 1;
        
        if (table) {
            ecs_vector_t *bitset_columns = table_data->bitset_columns;
            ecs_vector_t *sparse_columns = table_data->sparse_columns;
            data = ecs_table_get_data(table);
            ecs_assert(data != NULL, ECS_INTERNAL_ERROR, NULL);
            it->table_columns = data->columns;
            
            if (slice) {
                cur.first = slice[i].start_row;
                cur.count = slice[i].count;                
            } else {
                cur.first = 0;
                cur.count = ecs_table_count(table);
            }

            if (cur.count) {
                if (bitset_columns) {
            
                    if (bitset_column_next(table, bitset_columns, iter, 
                        &cur) == -1) 
                    {
                        /* No more enabled components for table */
                        continue; 
                    } else {
                        iter->index = i;
                    }
                }

                if (sparse_columns) {
                    if (sparse_column_next(table, table_data,
                        sparse_columns, iter, &cur) == -1)
                    {
                        /* No more elements in sparse column */
                        continue;    
                    } else {
                        iter->index = i;
                    }
                }

                int ret = ecs_page_iter_next(piter, &cur);
                if (ret < 0) {
                    return false;
                } else if (ret > 0) {
                    continue;
                }
            } else {
                continue;
            }

            ecs_entity_t *entity_buffer = ecs_vector_first(
                data->entities, ecs_entity_t); 
            it->entities = &entity_buffer[cur.first];
            it->offset = cur.first;
            it->count = cur.count;
            it->total_count = cur.count;
        }

        it->table = &table_data->iter_data;
        it->frame_offset += prev_count;

        if (query->flags & EcsQueryHasOutColumns) {
            if (table) {
                mark_columns_dirty(query, table_data);
            }
        }

        return true;
    }

    return false;
}